

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O2

void __thiscall HighsSearch::installNode(HighsSearch *this,OpenNode *node)

{
  double dVar1;
  int iVar2;
  int col;
  int *piVar3;
  pointer pHVar4;
  pointer pdVar5;
  bool bVar6;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var7;
  int *piVar8;
  void *local_40;
  __shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  HighsDomain::setDomainChangeStack(&this->localdom,&node->domchgstack,&node->branchings);
  _Var7._M_head_impl =
       (this->mipsolver->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  if (*(long *)&((_Var7._M_head_impl)->globalOrbits).
                super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2> != 0) {
    piVar3 = (this->localdom).branchPos_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar8 = (this->localdom).branchPos_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar8 != piVar3; piVar8 = piVar8 + 1) {
      iVar2 = *piVar8;
      col = (this->localdom).domchgstack_.
            super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
            super__Vector_impl_data._M_start[iVar2].column;
      _Var7._M_head_impl =
           (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      if ((*(int *)(*(long *)&((vector<int,_std::allocator<int>_> *)
                              ((long)&(_Var7._M_head_impl)->symmetries + 0x60))->
                              super__Vector_base<int,_std::allocator<int>_> + (long)col * 4) != -1)
         && ((bVar6 = HighsDomain::isBinary(&(_Var7._M_head_impl)->domain,col), !bVar6 ||
             (((pHVar4 = (this->localdom).domchgstack_.
                         super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                         _M_impl.super__Vector_impl_data._M_start, pHVar4[iVar2].boundtype == kLower
               && (dVar1 = pHVar4[iVar2].boundval, dVar1 == 1.0)) && (!NAN(dVar1))))))) {
        local_40 = (void *)0x0;
        local_38._M_ptr = (element_type *)0x0;
        local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        goto LAB_002e54ea;
      }
    }
    _Var7._M_head_impl =
         (this->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  }
  local_40 = (void *)0x0;
  std::__shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,
             &((_Var7._M_head_impl)->globalOrbits).
              super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>);
LAB_002e54ea:
  std::vector<HighsSearch::NodeData,std::allocator<HighsSearch::NodeData>>::
  emplace_back<double&,double&,decltype(nullptr),std::shared_ptr<StabilizerOrbits_const>>
            ((vector<HighsSearch::NodeData,std::allocator<HighsSearch::NodeData>> *)&this->nodestack
             ,&node->lower_bound,&node->estimate,&local_40,
             (shared_ptr<const_StabilizerOrbits> *)&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  pdVar5 = (this->subrootsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->subrootsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar5) {
    (this->subrootsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar5;
  }
  this->depthoffset = node->depth + -1;
  return;
}

Assistant:

void HighsSearch::installNode(HighsNodeQueue::OpenNode&& node) {
  localdom.setDomainChangeStack(node.domchgstack, node.branchings);
  bool globalSymmetriesValid = true;
  if (mipsolver.mipdata_->globalOrbits) {
    // if global orbits have been computed we check whether they are still valid
    // in this node
    const auto& domchgstack = localdom.getDomainChangeStack();
    for (HighsInt i : localdom.getBranchingPositions()) {
      HighsInt col = domchgstack[i].column;
      if (mipsolver.mipdata_->symmetries.columnPosition[col] == -1) continue;

      if (!mipsolver.mipdata_->domain.isBinary(col) ||
          (domchgstack[i].boundtype == HighsBoundType::kLower &&
           domchgstack[i].boundval == 1.0)) {
        globalSymmetriesValid = false;
        break;
      }
    }
  }
  nodestack.emplace_back(
      node.lower_bound, node.estimate, nullptr,
      globalSymmetriesValid ? mipsolver.mipdata_->globalOrbits : nullptr);
  subrootsol.clear();
  depthoffset = node.depth - 1;
}